

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzpostprocanalysis.cpp
# Opt level: O2

TPZCompEl * TPZPostProcAnalysis::CreateCubeEl(TPZGeoEl *gel,TPZCompMesh *mesh)

{
  TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapeCube>_> *this;
  
  if ((gel->fReference == (TPZCompEl *)0x0) && (gel->fNumInterfaces == 0)) {
    this = (TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapeCube>_> *)operator_new(0x168);
    TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapeCube>_>::TPZCompElPostProc(this,mesh,gel);
  }
  else {
    this = (TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapeCube>_> *)0x0;
  }
  return (TPZCompEl *)this;
}

Assistant:

TPZCompEl *TPZPostProcAnalysis::CreateCubeEl(TPZGeoEl *gel,TPZCompMesh &mesh) {
	if(!gel->Reference() && gel->NumInterfaces() == 0)
		return new TPZCompElPostProc<TPZCompElH1<TPZShapeCube> >(mesh,gel);
	return NULL;
}